

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O3

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,char character,char *fail)

{
  char *pcVar1;
  char *end;
  char *begin;
  BasicStringView<char> local_18;
  
  pcVar1 = this->_data;
  if (pcVar1 == (char *)0x0) {
LAB_0012a742:
    BasicStringView(&local_18,fail,0,(nullptr_t)0x0);
  }
  else {
    begin = pcVar1 + (this->_sizePlusFlags & 0x3fffffffffffffff);
    do {
      end = begin;
      begin = end + -1;
      if (begin < pcVar1) goto LAB_0012a742;
    } while (*begin != character);
    local_18 = slice(this,begin,end);
  }
  return local_18;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const char character, T* const fail) const {
    if(const char* const found = Implementation::stringFindLastCharacter(_data, size(), character))
        return slice(const_cast<T*>(found), const_cast<T*>(found + 1));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}